

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O2

int leveldb::test::RandomSeed(void)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  
  __nptr = getenv("TEST_RANDOM_SEED");
  if (__nptr == (char *)0x0) {
    iVar2 = 0x12d;
  }
  else {
    iVar1 = atoi(__nptr);
    iVar2 = 0x12d;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int RandomSeed() {
  const char* env = getenv("TEST_RANDOM_SEED");
  int result = (env != nullptr ? atoi(env) : 301);
  if (result <= 0) {
    result = 301;
  }
  return result;
}